

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer_holder.hpp
# Opt level: O2

void * __thiscall
boost::python::objects::
pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
::holds(pointer_holder<std::unique_ptr<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>,_LFPConsumer_python>
        *this,type_info dst_t,bool null_ptr_only)

{
  bool bVar1;
  LFPConsumer_python *pLVar2;
  type_info src_t;
  type_info local_28;
  type_info local_20;
  
  local_28.m_base_type = "St10unique_ptrI18LFPConsumer_pythonSt14default_deleteIS0_EE";
  local_20.m_base_type = dst_t.m_base_type;
  bVar1 = type_info::operator==(&local_20,&local_28);
  if (bVar1) {
    if ((!null_ptr_only) ||
       (pLVar2 = (this->m_p)._M_t.
                 super___uniq_ptr_impl<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_LFPConsumer_python_*,_std::default_delete<LFPConsumer_python>_>
                 .super__Head_base<0UL,_LFPConsumer_python_*,_false>._M_head_impl,
       pLVar2 == (LFPConsumer_python *)0x0)) {
      return &this->m_p;
    }
  }
  else {
    pLVar2 = (this->m_p)._M_t.
             super___uniq_ptr_impl<LFPConsumer_python,_std::default_delete<LFPConsumer_python>_>.
             _M_t.
             super__Tuple_impl<0UL,_LFPConsumer_python_*,_std::default_delete<LFPConsumer_python>_>.
             super__Head_base<0UL,_LFPConsumer_python_*,_false>._M_head_impl;
    if (pLVar2 == (LFPConsumer_python *)0x0) {
      return (LFPConsumer_python *)0x0;
    }
  }
  local_28.m_base_type = "18LFPConsumer_python";
  bVar1 = type_info::operator==(&local_28,&local_20);
  if (!bVar1) {
    pLVar2 = (LFPConsumer_python *)find_dynamic_type(pLVar2,local_28,local_20);
  }
  return pLVar2;
}

Assistant:

void* pointer_holder<Pointer, Value>::holds(type_info dst_t, bool null_ptr_only)
{
    typedef typename boost::python::detail::remove_const< Value >::type non_const_value;

    if (dst_t == python::type_id<Pointer>()
        && !(null_ptr_only && get_pointer(this->m_p))
    )
        return &this->m_p;

    Value* p0
#  if BOOST_WORKAROUND(__SUNPRO_CC, BOOST_TESTED_AT(0x590))
        = static_cast<Value*>( get_pointer(this->m_p) )
#  else 
        = get_pointer(this->m_p)
#  endif
        ;
    non_const_value* p = const_cast<non_const_value*>( p0 );

    if (p == 0)
        return 0;
    
    if (void* wrapped = holds_wrapped(dst_t, p, p))
        return wrapped;
    
    type_info src_t = python::type_id<non_const_value>();
    return src_t == dst_t ? p : find_dynamic_type(p, src_t, dst_t);
}